

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

char * cmSHA384_Data(sha_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA_CTX context;
  SHA_CTX local_f0;
  
  cmSHA384_Init(&local_f0);
  cmSHA512_Update(&local_f0,data,len);
  pcVar1 = cmSHA384_End(&local_f0,digest);
  return pcVar1;
}

Assistant:

char* SHA384_Data(const sha_byte* data, size_t len, char digest[SHA384_DIGEST_STRING_LENGTH]) {
	SHA_CTX	context;

	SHA384_Init(&context);
	SHA384_Update(&context, data, len);
	return SHA384_End(&context, digest);
}